

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

uchar * gen_publickey_from_dsa(LIBSSH2_SESSION *session,DSA *dsa,size_t *key_len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  BIGNUM **in_stack_ffffffffffffff88;
  BIGNUM *in_stack_ffffffffffffff90;
  BIGNUM *pub_key;
  BIGNUM *g;
  BIGNUM *q;
  BIGNUM *p_bn;
  uchar *p;
  uchar *key;
  unsigned_long len;
  int k_bytes;
  int g_bytes;
  int q_bytes;
  int p_bytes;
  size_t *key_len_local;
  DSA *dsa_local;
  LIBSSH2_SESSION *session_local;
  
  DSA_get0_pqg((DSA *)g,(BIGNUM **)pub_key,(BIGNUM **)in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88);
  DSA_get0_key(dsa,(BIGNUM **)&stack0xffffffffffffff90,(BIGNUM **)0x0);
  iVar1 = BN_num_bits((BIGNUM *)q);
  iVar1 = (iVar1 + 7) / 8 + 1;
  iVar2 = BN_num_bits((BIGNUM *)g);
  iVar2 = (iVar2 + 7) / 8 + 1;
  iVar3 = BN_num_bits((BIGNUM *)pub_key);
  iVar3 = (iVar3 + 7) / 8 + 1;
  iVar4 = BN_num_bits((BIGNUM *)in_stack_ffffffffffffff90);
  iVar4 = (iVar4 + 7) / 8 + 1;
  session_local =
       (LIBSSH2_SESSION *)
       (*session->alloc)((long)(iVar1 + iVar2 + iVar3 + 0x1b + iVar4),&session->abstract);
  if (session_local == (LIBSSH2_SESSION *)0x0) {
    session_local = (LIBSSH2_SESSION *)0x0;
  }
  else {
    _libssh2_htonu32((uchar *)session_local,7);
    builtin_memcpy((uchar *)((long)&session_local->abstract + 4),"ssh-",4);
    *(undefined2 *)&session_local->alloc = 0x7364;
    *(undefined1 *)((long)&session_local->alloc + 2) = 0x73;
    puVar5 = write_bn((uchar *)((long)&session_local->alloc + 3),q,iVar1);
    puVar5 = write_bn(puVar5,g,iVar2);
    puVar5 = write_bn(puVar5,pub_key,iVar3);
    puVar5 = write_bn(puVar5,in_stack_ffffffffffffff90,iVar4);
    *key_len = (long)puVar5 - (long)session_local;
  }
  return (uchar *)session_local;
}

Assistant:

static unsigned char *
gen_publickey_from_dsa(LIBSSH2_SESSION* session, DSA *dsa,
                       size_t *key_len)
{
    int            p_bytes, q_bytes, g_bytes, k_bytes;
    unsigned long  len;
    unsigned char *key;
    unsigned char *p;

    const BIGNUM * p_bn;
    const BIGNUM * q;
    const BIGNUM * g;
    const BIGNUM * pub_key;
#ifdef HAVE_OPAQUE_STRUCTS
    DSA_get0_pqg(dsa, &p_bn, &q, &g);
#else
    p_bn = dsa->p;
    q = dsa->q;
    g = dsa->g;
#endif

#ifdef HAVE_OPAQUE_STRUCTS
    DSA_get0_key(dsa, &pub_key, NULL);
#else
    pub_key = dsa->pub_key;
#endif
    p_bytes = BN_num_bytes(p_bn) + 1;
    q_bytes = BN_num_bytes(q) + 1;
    g_bytes = BN_num_bytes(g) + 1;
    k_bytes = BN_num_bytes(pub_key) + 1;

    /* Key form is "ssh-dss" + p + q + g + pub_key. */
    len = 4 + 7 + 4 + p_bytes + 4 + q_bytes + 4 + g_bytes + 4 + k_bytes;

    key = LIBSSH2_ALLOC(session, len);
    if(key == NULL) {
        return NULL;
    }

    /* Process key encoding. */
    p = key;

    _libssh2_htonu32(p, 7);  /* Key type. */
    p += 4;
    memcpy(p, "ssh-dss", 7);
    p += 7;

    p = write_bn(p, p_bn, p_bytes);
    p = write_bn(p, q, q_bytes);
    p = write_bn(p, g, g_bytes);
    p = write_bn(p, pub_key, k_bytes);

    *key_len = (size_t)(p - key);
    return key;
}